

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm-sync-common.c
# Opt level: O3

void sync_notify(Sync *sync)

{
  int iVar1;
  
  iVar1 = pthread_cond_signal((pthread_cond_t *)&sync->condition);
  if (iVar1 == 0) {
    return;
  }
  throw("Error signalling condition variable");
}

Assistant:

void sync_notify(struct Sync* sync) {
	// Signals to a single thread waiting on the condition variable
	// to wake up, if any such thread exists. An alternative would be
	// to call pthread_cond_broadcast, in which case *all* waiting
	// threads would be woken up.
	if (pthread_cond_signal(&sync->condition) != 0) {
		throw("Error signalling condition variable");
	}
}